

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.h
# Opt level: O3

ArrayRef<int> * __thiscall
mp::BasicProblem<mp::BasicProblemParams<int>_>::ReadIntSuffix
          (ArrayRef<int> *__return_storage_ptr__,BasicProblem<mp::BasicProblemParams<int>_> *this,
          SuffixDef<int> *sufdef)

{
  pointer pcVar1;
  CStringRef msg;
  StringRef name;
  SuffixBase SVar2;
  Error *this_00;
  int *in_R8;
  bool bVar3;
  ArrayRef<int> suf_int;
  undefined1 local_a4 [8];
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined4 uStack_94;
  uint local_90;
  long *local_88 [2];
  long local_78 [2];
  ArrayRef<int> local_68;
  char *local_38;
  size_t sStack_30;
  
  SVar2.impl_ = (Impl *)FindSuffix<int>(this,sufdef);
  if ((SuffixBase)SVar2.impl_ != (SuffixBase)0x0) {
    local_68.data_ = *(int **)&(SVar2.impl_)->field_3;
    local_68.size_ = (size_t)(SVar2.impl_)->num_values;
    local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (local_68.size_ != 0) {
      (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->data_ = (int *)0x0;
      (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      __return_storage_ptr__->size_ = 0;
      ArrayRef<int>::init_from_rvalue<mp::ArrayRef<int>>(__return_storage_ptr__,&local_68);
      if (local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start == (pointer)0x0) {
        return __return_storage_ptr__;
      }
      operator_delete(local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_68.save_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
  }
  local_a4._4_4_ = *(undefined4 *)&(sufdef->name_).data_;
  uStack_9c = *(undefined4 *)((long)&(sufdef->name_).data_ + 4);
  uStack_98 = (undefined4)(sufdef->name_).size_;
  uStack_94 = *(undefined4 *)((long)&(sufdef->name_).size_ + 4);
  local_90 = sufdef->kind_;
  pcVar1 = (sufdef->tab_)._M_dataplus._M_p;
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_88,pcVar1,pcVar1 + (sufdef->tab_)._M_string_length);
  name.data_._4_4_ = uStack_9c;
  name.data_._0_4_ = local_a4._4_4_;
  name.size_._0_4_ = uStack_98;
  name.size_._4_4_ = uStack_94;
  SVar2.impl_ = (Impl *)BasicSuffixSet<std::allocator<char>_>::Find
                                  ((this->super_SuffixManager).suffixes_ + (local_90 & 3),name);
  bVar3 = true;
  if (((SuffixBase)SVar2.impl_ != (SuffixBase)0x0) && (((SVar2.impl_)->kind & 4) != 0)) {
    bVar3 = (SVar2.impl_)->num_values == 0;
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (bVar3) {
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __return_storage_ptr__->data_ = (int *)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->save_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    __return_storage_ptr__->size_ = 0;
    return __return_storage_ptr__;
  }
  this_00 = (Error *)__cxa_allocate_exception(0x18);
  local_38 = (sufdef->name_).data_;
  sStack_30 = (sufdef->name_).size_;
  local_a4._0_4_ = sufdef->kind_;
  fmt::format<fmt::BasicStringRef<char>,int>
            ((string *)(local_a4 + 4),
             (fmt *)"Expected integer suffix .{}, kind {},\nbut fractional values provided",
             (CStringRef)&local_38,(BasicStringRef<char> *)local_a4,in_R8);
  msg.data_._4_4_ = uStack_9c;
  msg.data_._0_4_ = local_a4._4_4_;
  Error::Error(this_00,msg,-1);
  __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
}

Assistant:

ArrayRef<int> ReadIntSuffix(const SuffixDef<int>& sufdef) {
    auto suf_int = ReadSuffix_OneTypeOnly(sufdef);
    if (!suf_int) {
      auto suf_dbl = ReadSuffix_OneTypeOnly(sufdef.to_type<double>());
      MP_ASSERT_ALWAYS(!suf_dbl,
                       fmt::format("Expected integer suffix .{}, kind {},\n"
                                   "but fractional values provided",
                                   sufdef.name(), sufdef.kind()));
      return {};
    }
    return suf_int;
  }